

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

Uint32 Diligent::PipelineStateUtils::GetRenderTargetMask(GraphicsPipelineDesc *GraphicsPipeline)

{
  uint uVar1;
  Uint32 rt;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0xb;
  uVar1 = 0;
  for (uVar2 = 0; GraphicsPipeline->NumRenderTargets != uVar2; uVar2 = uVar2 + 1) {
    if ((GraphicsPipeline->RTVFormats[uVar2] != TEX_FORMAT_UNKNOWN) &&
       (*(char *)((long)(GraphicsPipeline->BlendDesc).RenderTargets + lVar3 + -2) != '\0')) {
      uVar1 = uVar1 | 1 << ((uint)uVar2 & 0x1f);
    }
    lVar3 = lVar3 + 10;
  }
  return uVar1;
}

Assistant:

Uint32 GetRenderTargetMask(const GraphicsPipelineDesc& GraphicsPipeline) noexcept
{
    Uint32 RTMask = 0;
    for (Uint32 rt = 0; rt < GraphicsPipeline.NumRenderTargets; ++rt)
    {
        if (GraphicsPipeline.RTVFormats[rt] != TEX_FORMAT_UNKNOWN &&
            GraphicsPipeline.BlendDesc.RenderTargets[rt].RenderTargetWriteMask != COLOR_MASK_NONE)
        {
            RTMask |= (1u << rt);
        }
    }
    return RTMask;
}